

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

int fft_segment_inv(mixed_segment *segment)

{
  uint n;
  uint uVar1;
  float *pSrc;
  long lVar2;
  void *__dest;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  float fVar11;
  double dVar12;
  uint32_t out_samples;
  uint32_t in_samples;
  float *out;
  float *in;
  uint32_t local_e0;
  uint local_dc;
  undefined8 *local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  double local_a8;
  double local_a0;
  size_t local_98;
  float *local_90;
  size_t local_88;
  void *local_80;
  ulong local_78;
  ulong local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  float *local_40;
  float *local_38;
  
  local_d8 = (undefined8 *)segment->data;
  n = *(uint *)((long)local_d8 + 0x14);
  uVar6 = (ulong)n;
  local_b8 = (ulong)*(uint *)(local_d8 + 3);
  local_d0 = local_d8[5];
  pSrc = (float *)local_d8[6];
  lVar2 = local_d8[7];
  __dest = (void *)local_d8[8];
  local_e0 = 0xffffffff;
  local_c0 = n / local_b8;
  local_c8 = uVar6 - local_c0;
  if (local_d8[4] == 0) {
    local_d8[4] = local_c8;
  }
  uVar1 = *(uint *)(local_d8 + 2);
  local_dc = n;
  mixed_buffer_request_write(&local_40,&local_e0,(mixed_buffer *)local_d8[1]);
  uVar9 = 0;
  if (local_e0 != 0) {
    local_a8 = (double)uVar6;
    local_58 = (double)uVar1 / local_a8;
    local_60 = (double)(long)local_b8;
    local_50 = ((double)(long)local_c0 * 6.283185307179586) / local_a8;
    local_70 = (ulong)(n + 2);
    local_78 = (ulong)(n * 2);
    local_68 = (double)(long)(local_b8 * (n >> 1));
    local_80 = (void *)((long)__dest + local_c0 * 4);
    local_88 = uVar6 * 4;
    local_90 = pSrc + local_70;
    local_98 = (local_78 - local_70) * 4;
    uVar9 = 0;
    lVar8 = local_d0;
    lVar7 = local_c8;
    puVar10 = local_d8;
    uVar3 = local_e0;
    do {
      lVar5 = puVar10[4];
      local_40[uVar9] = *(float *)(lVar8 + (lVar5 - lVar7) * 4);
      lVar5 = lVar5 + 1;
      puVar10[4] = lVar5;
      if ((long)uVar6 <= lVar5) {
        puVar10[4] = lVar7;
        local_b0 = uVar9;
        iVar4 = mixed_buffer_request_read(&local_38,&local_dc,(mixed_buffer *)*puVar10);
        uVar9 = local_b0;
        if (iVar4 == 0) break;
        mixed_buffer_finish_read(local_dc,(mixed_buffer *)*puVar10);
        lVar8 = 0;
        do {
          local_a0 = (double)local_38[lVar8 * 2 + 1];
          fVar11 = (float)((double)*(float *)(lVar2 + lVar8 * 4) +
                          (double)lVar8 * local_50 +
                          ((((double)local_38[lVar8 * 2] - (double)lVar8 * local_58) / local_58) *
                          6.283185307179586) / local_60);
          *(float *)(lVar2 + lVar8 * 4) = fVar11;
          local_48 = (double)fVar11;
          dVar12 = cos(local_48);
          pSrc[lVar8 * 2] = (float)(dVar12 * local_a0);
          dVar12 = sin(local_48);
          pSrc[lVar8 * 2 + 1] = (float)(dVar12 * local_a0);
          lVar8 = lVar8 + 1;
        } while ((ulong)(n >> 1) + 1 != lVar8);
        if ((uint)local_70 < (uint)local_78) {
          memset(local_90,0,local_98);
        }
        spiral_fft_float(n,1,pSrc,pSrc);
        if (uVar6 != 0) {
          uVar9 = 0;
          do {
            dVar12 = cos(((double)(long)uVar9 * 6.283185307179586) / local_a8);
            dVar12 = dVar12 * -0.5 + 0.5;
            *(float *)((long)__dest + uVar9 * 4) =
                 (float)((double)*(float *)((long)__dest + uVar9 * 4) +
                        ((double)pSrc[uVar9 * 2] * (dVar12 + dVar12)) / local_68);
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        if ((uint)local_b8 <= n) {
          uVar9 = 0;
          do {
            *(undefined4 *)(local_d0 + uVar9 * 4) = *(undefined4 *)((long)__dest + uVar9 * 4);
            uVar9 = uVar9 + 1;
          } while (uVar9 < local_c0);
        }
        memmove(__dest,local_80,local_88);
        lVar8 = local_d0;
        uVar9 = local_b0;
        lVar7 = local_c8;
        puVar10 = local_d8;
        uVar3 = local_e0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar3);
  }
  mixed_buffer_finish_write((uint32_t)uVar9,(mixed_buffer *)local_d8[1]);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_inv(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict out_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict phase_sum = data->phase;
  float *restrict output_accumulator = data->accumulator;

  float *restrict in, *restrict out;
  uint32_t in_samples = framesize;
  uint32_t out_samples = UINT32_MAX;

  double magnitude, phase, tmp, window;
  long i, k;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  mixed_buffer_request_write(&out, &out_samples, data->out);
  for(i=0; i<out_samples; i++){
    out[i] = out_fifo[data->overlap-fifo_latency];
    data->overlap++;

    if(data->overlap >= framesize){
      data->overlap = fifo_latency;
      
      if(!mixed_buffer_request_read(&in, &in_samples, data->in))
        break;
      mixed_buffer_finish_read(in_samples, data->in);
      for(k=0; k<=framesize2; k++){
        tmp = in[k*2];
        magnitude = in[k*2+1];

        tmp -= (double)k*bin_frequencies;
        tmp /= bin_frequencies;
        tmp = 2.*M_PI*tmp/oversampling;
        tmp += (double)k*expected;
        phase_sum[k] += tmp;
        phase = phase_sum[k];

        fft_workspace[2*k] = magnitude*cos(phase);
        fft_workspace[2*k+1] = magnitude*sin(phase);
      } 

      for(k=framesize+2; k<2*framesize; k++) fft_workspace[k] = 0.;

      spiral_fft_float(framesize, +1, fft_workspace, fft_workspace);

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        output_accumulator[k] += 2.*window*fft_workspace[2*k]/(framesize2*oversampling);
      }
      for(k=0; k<step; k++) out_fifo[k] = output_accumulator[k];

      memmove(output_accumulator, output_accumulator+step, framesize*sizeof(float));
    }
  }
  mixed_buffer_finish_write(i, data->out);

  return 1;
}